

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O2

SubdirectoryDisposer *
ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::
useApprovalsSubdirectory(SubdirectoryDisposer *__return_storage_ptr__,string *subdirectory)

{
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,(string *)subdirectory);
  SubdirectoryDisposer::SubdirectoryDisposer(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static SubdirectoryDisposer
        useApprovalsSubdirectory(const std::string& subdirectory = "approval_tests")
        {
            return SubdirectoryDisposer(subdirectory);
        }